

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::Track::Track(Track *this,Dictionary *d)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  MDDEntry *pMVar3;
  
  GenericTrack::GenericTrack(&this->super_GenericTrack,d);
  (this->super_GenericTrack).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__Track_00217360;
  (this->EditRate).super_Rational.Numerator = 0;
  (this->EditRate).super_Rational.Denominator = 0;
  this->Origin = 0;
  (this->EditRate).super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00216710;
  this_00 = (this->super_GenericTrack).super_InterchangeObject.m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar3 = Dictionary::Type(this_00,MDD_Track);
    uVar1 = *(undefined8 *)pMVar3->ul;
    uVar2 = *(undefined8 *)(pMVar3->ul + 8);
    (this->super_GenericTrack).super_InterchangeObject.super_KLVPacket.m_UL.super_Identifier<16U>.
    m_HasValue = true;
    *(undefined8 *)
     (this->super_GenericTrack).super_InterchangeObject.super_KLVPacket.m_UL.super_Identifier<16U>.
     m_Value = uVar1;
    *(undefined8 *)
     ((this->super_GenericTrack).super_InterchangeObject.super_KLVPacket.m_UL.super_Identifier<16U>.
      m_Value + 8) = uVar2;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x370,"ASDCP::MXF::Track::Track(const Dictionary *)");
}

Assistant:

Track::Track(const Dictionary* d) : GenericTrack(d), Origin(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_Track);
}